

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByNumber
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  bool bVar1;
  int iVar2;
  pointer pTVar3;
  DescriptorPool *pDVar4;
  FieldDescriptor *result;
  MutexLockMaybe lock;
  FieldDescriptor *result_1;
  ReaderMutexLock lock_1;
  int number_local;
  Descriptor *extendee_local;
  DescriptorPool *this_local;
  
  lock_1.mu_._4_4_ = number;
  iVar2 = Descriptor::extension_range_count(extendee);
  if (iVar2 == 0) {
    return (FieldDescriptor *)0x0;
  }
  if (this->mutex_ != (WrappedMutex *)0x0) {
    internal::MutexLock::MutexLock((MutexLock *)&result_1,this->mutex_);
    pTVar3 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    pDVar4 = (DescriptorPool *)Tables::FindExtension(pTVar3,extendee,lock_1.mu_._4_4_);
    if (pDVar4 != (DescriptorPool *)0x0) {
      this_local = pDVar4;
    }
    lock.mu_._1_3_ = 0;
    lock.mu_._0_1_ = pDVar4 != (DescriptorPool *)0x0;
    internal::MutexLock::~MutexLock((MutexLock *)&result_1);
    if ((uint)lock.mu_ != 0) {
      return (FieldDescriptor *)this_local;
    }
  }
  internal::MutexLockMaybe::MutexLockMaybe((MutexLockMaybe *)&result,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    pTVar3 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pTVar3->known_bad_symbols_);
    pTVar3 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pTVar3->known_bad_files_);
  }
  pTVar3 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(&this->tables_);
  this_local = (DescriptorPool *)Tables::FindExtension(pTVar3,extendee,lock_1.mu_._4_4_);
  if ((this_local == (DescriptorPool *)0x0) &&
     ((this->underlay_ == (DescriptorPool *)0x0 ||
      (this_local = (DescriptorPool *)
                    FindExtensionByNumber(this->underlay_,extendee,lock_1.mu_._4_4_),
      this_local == (DescriptorPool *)0x0)))) {
    bVar1 = TryFindExtensionInFallbackDatabase(this,extendee,lock_1.mu_._4_4_);
    if (bVar1) {
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      this_local = (DescriptorPool *)Tables::FindExtension(pTVar3,extendee,lock_1.mu_._4_4_);
      if (this_local != (DescriptorPool *)0x0) goto LAB_0064a2e7;
    }
    this_local = (DescriptorPool *)0x0;
  }
LAB_0064a2e7:
  lock.mu_._0_4_ = 1;
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)&result);
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByNumber(
    const Descriptor* extendee, int number) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  // A faster path to reduce lock contention in finding extensions, assuming
  // most extensions will be cache hit.
  if (mutex_ != nullptr) {
    ReaderMutexLock lock(mutex_);
    const FieldDescriptor* result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
  }
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != nullptr) {
    return result;
  }
  if (underlay_ != nullptr) {
    result = underlay_->FindExtensionByNumber(extendee, number);
    if (result != nullptr) return result;
  }
  if (TryFindExtensionInFallbackDatabase(extendee, number)) {
    result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
  }
  return nullptr;
}